

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

FileTypeEnum
adios2sys::SystemTools::DetectFileType(char *filename,unsigned_long length,double percent_bin)

{
  bool bVar1;
  FILE *pFVar2;
  byte *__ptr;
  size_t sVar3;
  ulong in_RSI;
  char *in_RDI;
  double in_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double current_percent_bin;
  uchar *buffer_end;
  uchar *ptr;
  size_t text_count;
  size_t read_length;
  uchar *buffer;
  FILE *fp;
  string *in_stack_00000fe8;
  char *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  byte *local_a8;
  long local_a0;
  allocator local_81;
  string local_80 [32];
  FILE *local_60;
  allocator local_41;
  string local_40 [32];
  double local_20;
  ulong local_18;
  char *local_10;
  FileTypeEnum local_4;
  
  if ((in_RDI == (char *)0x0) || (in_XMM0_Qa < 0.0)) {
    local_4 = FileTypeUnknown;
  }
  else {
    local_20 = in_XMM0_Qa;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,in_RDI,&local_41);
    bVar1 = FileIsDirectory(in_stack_00000fe8);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      local_4 = FileTypeUnknown;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,local_10,&local_81);
      pFVar2 = (FILE *)Fopen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      if (pFVar2 == (FILE *)0x0) {
        local_4 = FileTypeUnknown;
      }
      else {
        local_60 = pFVar2;
        __ptr = (byte *)operator_new__(local_18);
        sVar3 = fread(__ptr,1,local_18,local_60);
        fclose(local_60);
        if (sVar3 == 0) {
          if (__ptr != (byte *)0x0) {
            operator_delete__(__ptr);
          }
          local_4 = FileTypeUnknown;
        }
        else {
          local_a0 = 0;
          for (local_a8 = __ptr; local_a8 != __ptr + sVar3; local_a8 = local_a8 + 1) {
            if ((((0x1f < *local_a8) && (*local_a8 < 0x80)) || (*local_a8 == 10)) ||
               ((*local_a8 == 0xd || (*local_a8 == 9)))) {
              local_a0 = local_a0 + 1;
            }
          }
          if (__ptr != (byte *)0x0) {
            operator_delete__(__ptr);
          }
          local_a0 = sVar3 - local_a0;
          auVar4._8_4_ = (int)((ulong)local_a0 >> 0x20);
          auVar4._0_8_ = local_a0;
          auVar4._12_4_ = 0x45300000;
          auVar5._8_4_ = (int)(sVar3 >> 0x20);
          auVar5._0_8_ = sVar3;
          auVar5._12_4_ = 0x45300000;
          if (((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_a0) - 4503599627370496.0)) /
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) < local_20) {
            local_4 = FileTypeText;
          }
          else {
            local_4 = FileTypeBinary;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

SystemTools::FileTypeEnum SystemTools::DetectFileType(const char* filename,
                                                      unsigned long length,
                                                      double percent_bin)
{
  if (!filename || percent_bin < 0) {
    return SystemTools::FileTypeUnknown;
  }

  if (SystemTools::FileIsDirectory(filename)) {
    return SystemTools::FileTypeUnknown;
  }

  FILE* fp = Fopen(filename, "rb");
  if (!fp) {
    return SystemTools::FileTypeUnknown;
  }

  // Allocate buffer and read bytes

  auto* buffer = new unsigned char[length];
  size_t read_length = fread(buffer, 1, length, fp);
  fclose(fp);
  if (read_length == 0) {
    delete[] buffer;
    return SystemTools::FileTypeUnknown;
  }

  // Loop over contents and count

  size_t text_count = 0;

  const unsigned char* ptr = buffer;
  const unsigned char* buffer_end = buffer + read_length;

  while (ptr != buffer_end) {
    if ((*ptr >= 0x20 && *ptr <= 0x7F) || *ptr == '\n' || *ptr == '\r' ||
        *ptr == '\t') {
      text_count++;
    }
    ptr++;
  }

  delete[] buffer;

  double current_percent_bin = (static_cast<double>(read_length - text_count) /
                                static_cast<double>(read_length));

  if (current_percent_bin >= percent_bin) {
    return SystemTools::FileTypeBinary;
  }

  return SystemTools::FileTypeText;
}